

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTest.cpp
# Opt level: O0

void __thiscall
ninx_parser::test_parse_block_not_closing::test_method(test_parse_block_not_closing *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *prev;
  ParserException *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[75],_const_char_(&)[75]> local_3c0;
  assertion_result local_3a0;
  basic_cstring<const_char> local_388;
  basic_cstring<const_char> local_378;
  undefined1 local_368 [24];
  basic_cstring<const_char> local_350;
  allocator local_339;
  string local_338;
  undefined1 local_318 [8];
  Parser parser;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  string local_290;
  undefined1 local_270 [8];
  Lexer lexer;
  string local_1f0 [8];
  string origin;
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream ss;
  test_parse_block_not_closing *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"$a = {    this block will not close",&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"test",(allocator *)&lexer.field_0x77);
  std::allocator<char>::~allocator((allocator<char> *)&lexer.field_0x77);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,"tests",
             (allocator *)
             ((long)&tokens.
                     super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ninx::lexer::Lexer::Lexer((Lexer *)local_270,(istream *)local_198,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tokens.
                     super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ninx::lexer::Lexer::generate
            ((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
              *)&parser.operators._M_h._M_single_bucket,(Lexer *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"tests",&local_339);
  ninx::parser::Parser::Parser
            ((Parser *)local_318,
             (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
              *)&parser.operators._M_h._M_single_bucket,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/parser/ParserTest.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)(local_368 + 8));
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_350,0x2c,local_368 + 8);
    ninx::parser::Parser::parse((Parser *)local_368);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_368);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_378,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/parser/ParserTest.cpp"
                 ,0x67);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_388);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_378,0x2c,&local_388);
      boost::test_tools::assertion_result::assertion_result(&local_3a0,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_3c0,prev,
                 (char (*) [75])
                 "exception ninx::parser::exception::ParserException expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/parser/ParserTest.cpp"
                 ,0x67);
      boost::test_tools::tt_detail::report_assertion(&local_3a0,&local_3c0,&ex,0x2c,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[75],_const_char_(&)[75]>::
      ~lazy_ostream_impl(&local_3c0);
      boost::test_tools::assertion_result::~assertion_result(&local_3a0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  ninx::parser::Parser::~Parser((Parser *)local_318);
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             *)&parser.operators._M_h._M_single_bucket);
  ninx::lexer::Lexer::~Lexer((Lexer *)local_270);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_parse_block_not_closing)
    {
        std::istringstream ss(
                "$a = {"
                "    this block will not close"
                );
        std::string origin {"test"};
        ninx::lexer::Lexer lexer {ss, "tests"};
        auto tokens = lexer.generate();
        ninx::parser::Parser parser{tokens, "tests"};

        BOOST_CHECK_THROW(parser.parse(), ninx::parser::exception::ParserException);
    }